

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

Memory * wasm::
         addModuleElement<std::vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>,std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>,wasm::Memory>
                   (vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                    *v,unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
                       *m,unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *curr,
                   string *funcName)

{
  ostream *this;
  Memory *pMVar1;
  char *pcVar2;
  mapped_type __k;
  mapped_type pMVar3;
  mapped_type *ppMVar4;
  string *psVar5;
  Name name;
  Name name_00;
  undefined1 local_1b0 [392];
  
  pMVar1 = (curr->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
           .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  pcVar2 = *(char **)((long)&(pMVar1->super_Importable).super_Named + 8);
  if (pcVar2 == (char *)0x0) {
    Fatal::Fatal((Fatal *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 0x10),"Module::",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x10),(funcName->_M_dataplus)._M_p,funcName->_M_string_length
              );
    Fatal::operator<<((Fatal *)local_1b0,(char (*) [13])": empty name");
  }
  else {
    name.super_IString.str._M_str = (char *)funcName;
    name.super_IString.str._M_len = (size_t)pcVar2;
    psVar5 = funcName;
    pMVar3 = getModuleElementOrNull<std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>>
                       ((wasm *)m,
                        *(unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
                          **)&(pMVar1->super_Importable).super_Named,name);
    if (pMVar3 == (mapped_type)0x0) {
      __k = (curr->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      ppMVar4 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Memory_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Memory_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)m,(key_type *)__k);
      *ppMVar4 = __k;
      std::
      vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>
      ::emplace_back<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>
                ((vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>
                  *)v,curr);
      return __k;
    }
    Fatal::Fatal((Fatal *)local_1b0);
    this = (ostream *)(local_1b0 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(this,"Module::",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (this,(funcName->_M_dataplus)._M_p,funcName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(this,": ",2);
    pMVar1 = (curr->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    name_00.super_IString.str._M_str = (char *)psVar5;
    name_00.super_IString.str._M_len =
         (size_t)*(char **)((long)&(pMVar1->super_Importable).super_Named + 8);
    operator<<((wasm *)this,*(ostream **)&(pMVar1->super_Importable).super_Named,name_00);
    Fatal::operator<<((Fatal *)local_1b0,(char (*) [16])" already exists");
  }
  Fatal::~Fatal((Fatal *)local_1b0);
}

Assistant:

Elem* addModuleElement(Vector& v,
                       Map& m,
                       std::unique_ptr<Elem> curr,
                       std::string funcName) {
  if (!curr->name.is()) {
    Fatal() << "Module::" << funcName << ": empty name";
  }
  if (getModuleElementOrNull(m, curr->name)) {
    Fatal() << "Module::" << funcName << ": " << curr->name
            << " already exists";
  }
  auto* ret = m[curr->name] = curr.get();
  v.push_back(std::move(curr));
  return ret;
}